

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void CEditor::AddImage(char *pFileName,int StorageType,void *pUser)

{
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *this;
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  CEditorImage *pImg;
  char aBuf [128];
  CEditorImage ImgInfo;
  CEditorImage *local_260;
  char local_258 [128];
  CEditorImage local_1d8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_1d8.m_Texture.m_Id = -1;
  local_1d8.m_External = 0;
  local_1d8.m_aName[0] = '\0';
  local_1d8.super_CImageInfo.m_Width = 0;
  local_1d8.super_CImageInfo.m_Height = 0;
  local_1d8.super_CImageInfo.m_pData = (void *)0x0;
  local_1d8.super_CImageInfo.m_Format = 0;
  local_1d8.m_pAutoMapper = (IAutoMapper *)0x0;
  local_1d8.m_pEditor = (CEditor *)pUser;
  iVar1 = (**(code **)(**(long **)((long)pUser + 0x30) + 0x70))
                    (*(long **)((long)pUser + 0x30),&local_1d8,pFileName,StorageType);
  if (iVar1 != 0) {
    ExtractName(pFileName,local_258,0x80);
    this = (array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)((long)pUser + 0x1260);
    if (0 < *(int *)((long)pUser + 0x126c)) {
      lVar2 = 0;
      do {
        iVar1 = str_comp(this->list[lVar2]->m_aName,local_258);
        if (iVar1 == 0) goto LAB_0019c72c;
        lVar2 = lVar2 + 1;
      } while (lVar2 < *(int *)((long)pUser + 0x126c));
    }
    local_260 = (CEditorImage *)operator_new(0x1b0);
    local_260->m_Texture = -1;
    local_260->m_External = 0;
    local_260->m_pEditor = (CEditor *)pUser;
    local_260->m_aName[0] = '\0';
    (local_260->super_CImageInfo).m_Width = 0;
    (local_260->super_CImageInfo).m_Height = 0;
    (local_260->super_CImageInfo).m_pData = (void *)0x0;
    (local_260->super_CImageInfo).m_Format = 0;
    local_260->m_pAutoMapper = (IAutoMapper *)0x0;
    memcpy(local_260,&local_1d8,0x1b0);
    iVar1 = (**(code **)(**(long **)((long)pUser + 0x30) + 0x80))
                      (*(long **)((long)pUser + 0x30),local_1d8.super_CImageInfo._0_8_ & 0xffffffff,
                       local_1d8.super_CImageInfo.m_Height,local_1d8.super_CImageInfo.m_Format,
                       local_1d8.super_CImageInfo.m_pData,0xffffffff,8);
    (local_260->m_Texture).m_Id = iVar1;
    local_1d8.super_CImageInfo.m_pData = (void *)0x0;
    local_260->m_External = 1;
    str_copy(local_260->m_aName,local_258,0x80);
    CEditorImage::LoadAutoMapper(local_260);
    array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::add(this,&local_260);
    SortImages((CEditor *)pUser);
    if (((-1 < *(int *)((long)pUser + 0x10f0)) &&
        (*(int *)((long)pUser + 0x10f0) < *(int *)((long)pUser + 0x126c))) &&
       (-1 < *(int *)((long)pUser + 0x10f0))) {
      lVar2 = -1;
      do {
        iVar1 = str_comp(this->list[lVar2 + 1]->m_aName,local_258);
        if (iVar1 == 0) {
          *(int *)((long)pUser + 0x10f0) = *(int *)((long)pUser + 0x10f0) + 1;
          break;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < *(int *)((long)pUser + 0x10f0));
    }
    *(undefined4 *)((long)pUser + 0x47c) = 0;
  }
LAB_0019c72c:
  CEditorImage::~CEditorImage(&local_1d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::AddImage(const char *pFileName, int StorageType, void *pUser)
{
	CEditor *pEditor = (CEditor *)pUser;
	CEditorImage ImgInfo(pEditor);
	if(!pEditor->Graphics()->LoadPNG(&ImgInfo, pFileName, StorageType))
		return;

	// check if we have that image already
	char aBuf[128];
	ExtractName(pFileName, aBuf, sizeof(aBuf));
	for(int i = 0; i < pEditor->m_Map.m_lImages.size(); ++i)
	{
		if(!str_comp(pEditor->m_Map.m_lImages[i]->m_aName, aBuf))
			return;
	}

	CEditorImage *pImg = new CEditorImage(pEditor);
	*pImg = ImgInfo;
	pImg->m_Texture = pEditor->Graphics()->LoadTextureRaw(ImgInfo.m_Width, ImgInfo.m_Height, ImgInfo.m_Format, ImgInfo.m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
	ImgInfo.m_pData = 0;
	pImg->m_External = 1;	// external by default
	str_copy(pImg->m_aName, aBuf, sizeof(pImg->m_aName));
	pImg->LoadAutoMapper();
	pEditor->m_Map.m_lImages.add(pImg);
	pEditor->SortImages();
	if(pEditor->m_SelectedImage > -1 && pEditor->m_SelectedImage < pEditor->m_Map.m_lImages.size())
	{
		for(int i = 0; i <= pEditor->m_SelectedImage; ++i)
			if(!str_comp(pEditor->m_Map.m_lImages[i]->m_aName, aBuf))
			{
				pEditor->m_SelectedImage++;
				break;
			}
	}
	pEditor->m_Dialog = DIALOG_NONE;
}